

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O1

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::line
          (ImGuiDrawListGraphicsAdaptor *this,float ax,float ay,float bx,float by,color *c,
          float thickness)

{
  ImDrawList *this_00;
  ImU32 col;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec4 local_28;
  
  this_00 = this->draw_list;
  local_28.y = *c->g;
  local_28.x = *c->r;
  local_28.w = *c->a;
  local_28.z = *c->b;
  local_38.x = bx;
  local_38.y = by;
  local_30.x = ax;
  local_30.y = ay;
  col = ImGui::ColorConvertFloat4ToU32(&local_28);
  ImDrawList::AddLine(this_00,&local_30,&local_38,col,thickness);
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::line(float ax, float ay, float bx, float by,
                                        const color::color& c,
                                        float thickness) {
    draw_list->AddLine(ImVec2(ax, ay), ImVec2(bx, by),
                       ImColor(c.r, c.g, c.b, c.a), thickness);
}